

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_completed_queue.cpp
# Opt level: O0

void __thiscall libtorrent::aux::disk_completed_queue::call_job_handlers(disk_completed_queue *this)

{
  disk_job *pdVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  disk_job **ppdVar5;
  disk_job *next;
  static_vector<libtorrent::aux::disk_job_*,_64UL,_void> to_delete;
  disk_job *local_28;
  disk_job *j;
  unique_lock<std::mutex> l;
  disk_completed_queue *this_local;
  
  l._8_8_ = this;
  counters::inc_stats_counter(this->m_stats_counters,0x41,1);
  ::std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&j,&this->m_completed_jobs_mutex);
  this->m_job_completions_in_flight = false;
  local_28 = tailqueue<libtorrent::aux::disk_job>::get_all(&this->m_completed_jobs);
  ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&j);
  boost::container::static_vector<libtorrent::aux::disk_job_*,_64UL,_void>::static_vector
            ((static_vector<libtorrent::aux::disk_job_*,_64UL,_void> *)&next);
  while (local_28 != (disk_job *)0x0) {
    pdVar1 = (local_28->super_tailqueue_node<libtorrent::aux::disk_job>).next;
    disk_job::call_callback(local_28);
    boost::container::
    vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
    ::push_back((vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
                 *)&next,&local_28);
    local_28 = pdVar1;
    sVar3 = boost::container::
            vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
            ::size((vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
                    *)&next);
    sVar4 = boost::container::static_vector<libtorrent::aux::disk_job_*,_64UL,_void>::capacity();
    if (sVar3 == sVar4) {
      ppdVar5 = boost::container::
                vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
                ::data((vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
                        *)&next);
      sVar3 = boost::container::
              vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
              ::size((vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
                      *)&next);
      ::std::function<void_(libtorrent::aux::disk_job_**,_int)>::operator()
                (&this->m_free_jobs,ppdVar5,(int)sVar3);
      boost::container::
      vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
      ::clear((vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
               *)&next);
    }
  }
  bVar2 = boost::container::
          vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
          ::empty((vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
                   *)&next);
  if (!bVar2) {
    ppdVar5 = boost::container::
              vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
              ::data((vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
                      *)&next);
    sVar3 = boost::container::
            vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
            ::size((vector<libtorrent::aux::disk_job_*,_boost::container::dtl::static_storage_allocator<libtorrent::aux::disk_job_*,_64UL,_0UL,_true>,_void>
                    *)&next);
    ::std::function<void_(libtorrent::aux::disk_job_**,_int)>::operator()
              (&this->m_free_jobs,ppdVar5,(int)sVar3);
  }
  boost::container::static_vector<libtorrent::aux::disk_job_*,_64UL,_void>::~static_vector
            ((static_vector<libtorrent::aux::disk_job_*,_64UL,_void> *)&next);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&j);
  return;
}

Assistant:

void disk_completed_queue::call_job_handlers()
{
	m_stats_counters.inc_stats_counter(counters::on_disk_counter);
	std::unique_lock<std::mutex> l(m_completed_jobs_mutex);

	DLOG("call_job_handlers (%d)\n", m_completed_jobs.size());

	TORRENT_ASSERT(m_job_completions_in_flight);
	m_job_completions_in_flight = false;

	auto* j = static_cast<aux::disk_job*>(m_completed_jobs.get_all());
	l.unlock();

	boost::container::static_vector<aux::disk_job*, 64> to_delete;

	while (j)
	{
		TORRENT_ASSERT(j->job_posted == true);
		TORRENT_ASSERT(j->callback_called == false);
		DLOG("   callback: %s\n", print_job(*j).c_str());
		auto* next = static_cast<aux::disk_job*>(j->next);

#if TORRENT_USE_ASSERTS
		j->callback_called = true;
#endif
		j->call_callback();
		to_delete.push_back(j);
		j = next;
		if (to_delete.size() == to_delete.capacity())
		{
			m_free_jobs(to_delete.data(), int(to_delete.size()));
			to_delete.clear();
		}
	}

	if (!to_delete.empty()) m_free_jobs(to_delete.data(), int(to_delete.size()));
}